

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O0

Bytes __thiscall
Omega_h::prevent_coarsen_flip(Omega_h *this,Mesh *mesh,LOs *cands2edges,Bytes *cand_codes)

{
  LOs *pLVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar3;
  Bytes BVar4;
  Read<signed_char> local_78;
  Read<int> local_68 [2];
  Read<signed_char> local_48;
  Read<int> local_38;
  Bytes *local_28;
  Bytes *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  
  local_28 = cand_codes;
  cand_codes_local = (Bytes *)cands2edges;
  cands2edges_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  IVar2 = Mesh::dim(mesh);
  pLVar1 = cands2edges_local;
  if (IVar2 == 3) {
    Read<int>::Read(&local_38,cands2edges);
    Read<signed_char>::Read(&local_48,cand_codes);
    prevent_coarsen_flip_dim<3>(this,(Mesh *)pLVar1,&local_38,&local_48);
    Read<signed_char>::~Read(&local_48);
    Read<int>::~Read(&local_38);
    pvVar3 = extraout_RDX;
  }
  else {
    IVar2 = Mesh::dim((Mesh *)cands2edges_local);
    pLVar1 = cands2edges_local;
    if (IVar2 == 2) {
      Read<int>::Read(local_68,cands2edges);
      Read<signed_char>::Read(&local_78,cand_codes);
      prevent_coarsen_flip_dim<2>(this,(Mesh *)pLVar1,local_68,&local_78);
      Read<signed_char>::~Read(&local_78);
      Read<int>::~Read(local_68);
      pvVar3 = extraout_RDX_00;
    }
    else {
      Read<signed_char>::Read((Read<signed_char> *)this,cand_codes);
      pvVar3 = extraout_RDX_01;
    }
  }
  BVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  BVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar4.write_.shared_alloc_;
}

Assistant:

Bytes prevent_coarsen_flip(Mesh* mesh, LOs cands2edges, Bytes cand_codes) {
  if (mesh->dim() == 3) {
    return prevent_coarsen_flip_dim<3>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2) {
    return prevent_coarsen_flip_dim<2>(mesh, cands2edges, cand_codes);
  }
  return cand_codes;
}